

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

counting_iterator
fmt::v9::detail::write_escaped_string<char,fmt::v9::detail::counting_iterator>
          (counting_iterator out,basic_string_view<char> str)

{
  char *pcVar1;
  anon_class_8_1_6971b95b_for_f in_RCX;
  detail *pdVar2;
  detail *this;
  counting_iterator it;
  counting_iterator cVar3;
  counting_iterator out_00;
  string_view s;
  find_escape_result<char> escape;
  find_escape_result<char> local_48;
  
  cVar3.count_ = out.count_ + 1;
  pdVar2 = (detail *)str.data_ + str.size_;
  this = (detail *)str.data_;
  do {
    local_48.end = (char *)0x0;
    local_48.cp = 0;
    s.data_ = pdVar2 + -(long)this;
    s.size_ = (size_t)&local_48;
    local_48.begin = (char *)pdVar2;
    for_each_codepoint<fmt::v9::detail::find_escape(char_const*,char_const*)::_lambda(unsigned_int,fmt::v9::basic_string_view<char>)_1_>
              (this,s,in_RCX);
    pcVar1 = local_48.end;
    out_00.count_ = (size_t)(local_48.begin + (cVar3.count_ - (long)this));
    if (this == (detail *)local_48.begin) {
      out_00.count_ = cVar3.count_;
    }
    cVar3.count_ = out_00.count_;
  } while (((detail *)local_48.end != (detail *)0x0) &&
          (cVar3 = write_escaped_cp<fmt::v9::detail::counting_iterator,char>(out_00,&local_48),
          this = (detail *)pcVar1, (detail *)pcVar1 != pdVar2));
  return (counting_iterator)(cVar3.count_ + 1);
}

Assistant:

auto write_escaped_string(OutputIt out, basic_string_view<Char> str)
    -> OutputIt {
  *out++ = static_cast<Char>('"');
  auto begin = str.begin(), end = str.end();
  do {
    auto escape = find_escape(begin, end);
    out = copy_str<Char>(begin, escape.begin, out);
    begin = escape.end;
    if (!begin) break;
    out = write_escaped_cp<OutputIt, Char>(out, escape);
  } while (begin != end);
  *out++ = static_cast<Char>('"');
  return out;
}